

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O0

float incoming(xr_key *key0,xr_key *key1,xr_key *key1_next)

{
  float fVar1;
  float extraout_XMM0_Da;
  float local_34;
  float in;
  float t;
  float d;
  float b;
  float a;
  xr_key *key1_next_local;
  xr_key *key1_local;
  xr_key *key0_local;
  
  switch(key1->shape) {
  case '\0':
    local_34 = (1.0 - key1->tension) * (1.0 - key1->continuity) * (key1->bias + 1.0);
    fVar1 = key1->value - key0->value;
    if (key1_next == (xr_key *)0x0) {
      local_34 = local_34 * fVar1;
    }
    else {
      local_34 = ((key1->time - key0->time) / (key1_next->time - key0->time)) *
                 ((1.0 - key1->tension) * (key1->continuity + 1.0) * (1.0 - key1->bias) *
                  (key1_next->value - key1->value) + local_34 * fVar1);
    }
    break;
  case '\x01':
  case '\x02':
    local_34 = key1->param[0];
    if (key1_next != (xr_key *)0x0) {
      local_34 = ((key1->time - key0->time) / (key1_next->time - key0->time)) * local_34;
    }
    break;
  case '\x03':
    local_34 = key1->value - key0->value;
    if (key1_next != (xr_key *)0x0) {
      local_34 = ((key1->time - key0->time) / (key1_next->time - key0->time)) *
                 ((key1_next->value - key1->value) + local_34);
    }
    break;
  case '\x04':
  default:
    local_34 = 0.0;
    break;
  case '\x05':
    local_34 = key1->param[1] * (key1->time - key0->time);
    std::abs((int)key0);
    if (extraout_XMM0_Da <= 1e-05) {
      local_34 = local_34 * 100000.0;
    }
    else {
      local_34 = local_34 / key1->param[0];
    }
  }
  return local_34;
}

Assistant:

static float incoming(const xr_key* key0, const xr_key* key1, const xr_key* key1_next)
{
	float a, b, d, t, in;
	switch (key1->shape) {
	case xr_key::SHAPE_LINE:
		d = key1->value - key0->value;
		if (key1_next) {
			t = (key1->time - key0->time)/(key1_next->time - key0->time);
			in = t*(key1_next->value - key1->value + d);
		} else {
			in = d;
		}
		break;

	case xr_key::SHAPE_TCB:
		a = (1.f - key1->tension)*(1.f - key1->continuity)*(1.f + key1->bias);
		b = (1.f - key1->tension)*(1.f + key1->continuity)*(1.f - key1->bias);
		d = key1->value - key0->value;
		if (key1_next) {
			t = (key1->time - key0->time)/(key1_next->time - key0->time);
			in = t*(b*(key1_next->value - key1->value) + a*d);
		} else {
			in = a*d;
		}
		break;

	case xr_key::SHAPE_BEZI:
	case xr_key::SHAPE_HERM:
		in = key1->param[0];
		if (key1_next)
			in *= (key1->time - key0->time)/(key1_next->time - key0->time);
		break;

	case xr_key::SHAPE_BEZ2:
		in = key1->param[1]*(key1->time - key0->time);
		if (std::abs(key1->param[0]) > 1e-5f)
			in /= key1->param[0];
		else
			in *= 1e+5f;
		break;

	case xr_key::SHAPE_STEP:
	default:
		in = 0.f;
		break;
	}
	return in;
}